

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::createImageFormatTypeTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  TestContext *pTVar1;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  TestNode *pTVar2;
  string *local_a0 [2];
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  undefined4 local_50;
  undefined4 uStack_4c;
  Function local_48;
  undefined4 uStack_40;
  VkImageType VStack_3c;
  undefined4 local_38;
  uint uStack_34;
  
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  local_80._M_allocated_capacity = (size_type)&local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_90 + 0x10),"optimal","");
  local_a0[0] = (string *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  local_48 = params.testFunction;
  uStack_40 = 0;
  VStack_3c = params.imageType;
  local_38 = 0;
  arg0.format = (int)((ulong)params.imageType << 0x20);
  arg0.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0.testFunction = params.testFunction;
  arg0._16_8_ = (ulong)uStack_34 << 0x20;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,(string *)local_80._M_allocated_capacity,local_a0[0],
                       createImageFormatTypeTilingTests,arg0)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_a0[0] != (string *)local_90) {
    operator_delete(local_a0[0],(ulong)(local_90._0_8_ + 1));
  }
  if ((string *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,(ulong)(local_70._M_dataplus._M_p + 1));
  }
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  local_80._M_allocated_capacity = (size_type)&local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_90 + 0x10),"linear","");
  local_a0[0] = (string *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  local_70.field_2._M_allocated_capacity = (size_type)params.testFunction;
  local_70.field_2._8_4_ = 0;
  local_70.field_2._12_4_ = params.imageType;
  local_50 = 1;
  arg0_00._20_4_ = uStack_4c;
  arg0_00.tiling = 1;
  arg0_00.format = (int)((ulong)params.imageType << 0x20);
  arg0_00.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0_00.testFunction = params.testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,(string *)local_80._M_allocated_capacity,local_a0[0],
                       createImageFormatTypeTilingTests,arg0_00)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_a0[0] != (string *)local_90) {
    operator_delete(local_a0[0],(ulong)(local_90._0_8_ + 1));
  }
  if ((string *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,(ulong)(local_70._M_dataplus._M_p + 1));
  }
  return;
}

Assistant:

void createImageFormatTypeTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.tiling == VK_IMAGE_TILING_LAST);

	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "optimal",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_OPTIMAL)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "linear",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_LINEAR)));
}